

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_file_sink.h
# Opt level: O0

filename_t *
spdlog::sinks::rotating_file_sink<std::mutex>::calc_filename
          (filename_t *__return_storage_ptr__,filename_t *filename,size_t index)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *extraout_RDX;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *extraout_RDX_00;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf;
  undefined1 local_2e0 [80];
  undefined1 local_290 [8];
  filename_t ext;
  filename_t basename;
  allocator<char> local_239;
  undefined1 local_238 [8];
  type w;
  size_t index_local;
  filename_t *filename_local;
  
  w._528_8_ = index;
  std::allocator<char>::allocator();
  ::fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_238,&local_239);
  std::allocator<char>::~allocator(&local_239);
  if (w._528_8_ == 0) {
    ::fmt::v5::format_to<char[3],std::__cxx11::string,500ul,char>
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_238,
               (char (*) [3])0x34106b,filename);
    buf = extraout_RDX_00;
  }
  else {
    std::__cxx11::string::string((string *)(ext.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_290);
    details::file_helper::split_by_extenstion
              ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(local_2e0 + 0x10),filename);
    __args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&ext.field_2 + 8);
    std::tie<std::__cxx11::string,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0,
               __args_1);
    std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
              ((tuple<std::__cxx11::string&,std::__cxx11::string&> *)local_2e0,
               (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(local_2e0 + 0x10));
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(local_2e0 + 0x10));
    ::fmt::v5::format_to<char[8],std::__cxx11::string,unsigned_long,std::__cxx11::string,500ul,char>
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_238,
               (char (*) [8])"{}.{}{}",__args_1,(unsigned_long *)(w.store_ + 0x1f0),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290);
    std::__cxx11::string::~string((string *)local_290);
    std::__cxx11::string::~string((string *)(ext.field_2._M_local_buf + 8));
    buf = extraout_RDX;
  }
  ::fmt::v5::to_string<char,500ul>(__return_storage_ptr__,(v5 *)local_238,buf);
  ::fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_238);
  return __return_storage_ptr__;
}

Assistant:

static filename_t calc_filename(const filename_t &filename, std::size_t index)
    {
        typename std::conditional<std::is_same<filename_t::value_type, char>::value, fmt::memory_buffer, fmt::wmemory_buffer>::type w;
        if (index != 0u)
        {
            filename_t basename, ext;
            std::tie(basename, ext) = details::file_helper::split_by_extenstion(filename);
            fmt::format_to(w, SPDLOG_FILENAME_T("{}.{}{}"), basename, index, ext);
        }
        else
        {
            fmt::format_to(w, SPDLOG_FILENAME_T("{}"), filename);
        }
        return fmt::to_string(w);
    }